

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void bitset_set_range(uint64_t *words,uint32_t start,uint32_t end)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (start != end) {
    uVar1 = start >> 6;
    uVar4 = (ulong)uVar1;
    uVar5 = end - 1 >> 6;
    uVar3 = -1L << ((byte)start & 0x3f);
    if (uVar1 == uVar5) {
      bVar2 = -(char)end;
      uVar4 = (uVar3 << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
      uVar3 = (ulong)uVar1;
    }
    else {
      words[uVar1] = words[uVar1] | uVar3;
      uVar3 = (ulong)uVar5;
      while (uVar4 = uVar4 + 1, uVar4 < uVar3) {
        words[uVar4] = 0xffffffffffffffff;
      }
      uVar4 = 0xffffffffffffffff >> (-(char)end & 0x3fU);
    }
    words[uVar3] = words[uVar3] | uVar4;
  }
  return;
}

Assistant:

static inline void bitset_set_range(uint64_t *words, uint32_t start,
                                    uint32_t end) {
    if (start == end) return;
    uint32_t firstword = start / 64;
    uint32_t endword = (end - 1) / 64;
    if (firstword == endword) {
        words[firstword] |= ((~UINT64_C(0)) << (start % 64)) &
                             ((~UINT64_C(0)) >> ((~end + 1) % 64));
        return;
    }
    words[firstword] |= (~UINT64_C(0)) << (start % 64);
    for (uint32_t i = firstword + 1; i < endword; i++) {
        words[i] = ~UINT64_C(0);
    }
    words[endword] |= (~UINT64_C(0)) >> ((~end + 1) % 64);
}